

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O0

uint32_t absl::lts_20240722::base_internal::SpinLock::EncodeWaitCycles
                   (int64_t wait_start_time,int64_t wait_end_time)

{
  long *plVar1;
  uint32_t kMinWaitTime;
  uint32_t clamped;
  int64_t scaled_wait_time;
  int64_t wait_end_time_local;
  int64_t wait_start_time_local;
  
  _kMinWaitTime = wait_end_time - wait_start_time >> 7;
  scaled_wait_time = wait_end_time;
  wait_end_time_local = wait_start_time;
  plVar1 = std::min<long>((long *)&kMinWaitTime,&EncodeWaitCycles::kMaxWaitTime);
  wait_start_time_local._4_4_ = (uint32_t)(*plVar1 << 3);
  if (wait_start_time_local._4_4_ == 0) {
    wait_start_time_local._4_4_ = 8;
  }
  else if (wait_start_time_local._4_4_ == 8) {
    wait_start_time_local._4_4_ = 0x10;
  }
  return wait_start_time_local._4_4_;
}

Assistant:

uint32_t SpinLock::EncodeWaitCycles(int64_t wait_start_time,
                                    int64_t wait_end_time) {
  static const int64_t kMaxWaitTime =
      std::numeric_limits<uint32_t>::max() >> kLockwordReservedShift;
  int64_t scaled_wait_time =
      (wait_end_time - wait_start_time) >> kProfileTimestampShift;

  // Return a representation of the time spent waiting that can be stored in
  // the lock word's upper bits.
  uint32_t clamped = static_cast<uint32_t>(
      std::min(scaled_wait_time, kMaxWaitTime) << kLockwordReservedShift);

  if (clamped == 0) {
    return kSpinLockSleeper;  // Just wake waiters, but don't record contention.
  }
  // Bump up value if necessary to avoid returning kSpinLockSleeper.
  const uint32_t kMinWaitTime =
      kSpinLockSleeper + (1 << kLockwordReservedShift);
  if (clamped == kSpinLockSleeper) {
    return kMinWaitTime;
  }
  return clamped;
}